

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

Define * find_define_by_token(Context_conflict1 *ctx)

{
  uint uVar1;
  IncludeState *pIVar2;
  char *__src;
  long lVar3;
  Define *pDVar4;
  char *pcVar5;
  char *pcVar6;
  char *sym;
  code *pcStack_30;
  char acStack_28 [8];
  
  pIVar2 = ctx->include_stack;
  if (pIVar2->tokenval == TOKEN_IDENTIFIER) {
    uVar1 = pIVar2->tokenlen;
    lVar3 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
    sym = acStack_28 + lVar3;
    __src = pIVar2->token;
    pcVar5 = acStack_28 + lVar3 + -8;
    pcVar5[0] = -0x7d;
    pcVar5[1] = -0x2b;
    pcVar5[2] = '\x14';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    memcpy(sym,__src,(ulong)uVar1);
    sym[uVar1] = '\0';
    pcVar6 = acStack_28 + lVar3 + -8;
    pcVar6[0] = -0x6d;
    pcVar6[1] = -0x2b;
    pcVar6[2] = '\x14';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    pDVar4 = find_define(ctx,sym);
    return pDVar4;
  }
  pcStack_30 = token_to_int;
  __assert_fail("state->tokenval == TOKEN_IDENTIFIER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x1e7,"const Define *find_define_by_token(Context *)");
}

Assistant:

static const Define *find_define_by_token(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    assert(state->tokenval == TOKEN_IDENTIFIER);
    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';
    return find_define(ctx, sym);
}